

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcxtexture.cpp
# Opt level: O1

void __thiscall FPCXTexture::FPCXTexture(FPCXTexture *this,int lumpnum,PCXHeader *hdr)

{
  undefined1 *puVar1;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,lumpnum);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FPCXTexture_008659e8;
  this->Pixels = (BYTE *)0x0;
  puVar1 = &(this->super_FTexture).field_0x31;
  *puVar1 = *puVar1 & 0xf7;
  (this->super_FTexture).Width = (hdr->xmax - hdr->xmin) + 1;
  (this->super_FTexture).Height = (hdr->ymax - hdr->ymin) + 1;
  FTexture::CalcBitSize(&this->super_FTexture);
  this->DummySpans[0].TopOffset = 0;
  this->DummySpans[0].Length = (this->super_FTexture).Height;
  this->DummySpans[1].TopOffset = 0;
  this->DummySpans[1].Length = 0;
  return;
}

Assistant:

FPCXTexture::FPCXTexture(int lumpnum, PCXHeader & hdr)
: FTexture(NULL, lumpnum), Pixels(0)
{
	bMasked = false;
	Width = LittleShort(hdr.xmax) - LittleShort(hdr.xmin) + 1;
	Height = LittleShort(hdr.ymax) - LittleShort(hdr.ymin) + 1;
	CalcBitSize();

	DummySpans[0].TopOffset = 0;
	DummySpans[0].Length = Height;
	DummySpans[1].TopOffset = 0;
	DummySpans[1].Length = 0;
}